

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httppost.cpp
# Opt level: O1

void __thiscall
hbm::HttpPost::HttpPost(HttpPost *this,string *address,string *port,string *httpPath)

{
  pointer pcVar1;
  runtime_error *this_00;
  
  (this->m_address)._M_dataplus._M_p = (pointer)&(this->m_address).field_2;
  pcVar1 = (address->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + address->_M_string_length);
  (this->m_port)._M_dataplus._M_p = (pointer)&(this->m_port).field_2;
  pcVar1 = (port->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_port,pcVar1,pcVar1 + port->_M_string_length);
  (this->m_httpPath)._M_dataplus._M_p = (pointer)&(this->m_httpPath).field_2;
  pcVar1 = (httpPath->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_httpPath,pcVar1,pcVar1 + httpPath->_M_string_length);
  if ((this->m_address)._M_string_length == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"no stream server address provided");
  }
  else if ((this->m_port)._M_string_length == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"no stream server control port provided");
  }
  else {
    if ((this->m_httpPath)._M_string_length != 0) {
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"no stream server path id provided");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

HttpPost::HttpPost(const std::string &address, const std::string &port, const std::string &httpPath)
		: m_address(address)
		, m_port(port)
		, m_httpPath(httpPath)
	{
		if(m_address.empty()) {
			throw std::runtime_error("no stream server address provided");
		}
		if(m_port.empty()) {
			throw std::runtime_error("no stream server control port provided");
		}
		if(m_httpPath.empty()) {
			throw std::runtime_error("no stream server path id provided");
		}

	}